

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O2

bool __thiscall
TxIndex::FindTx(TxIndex *this,uint256 *tx_hash,uint256 *block_hash,CTransactionRef *tx)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  CDiskTxPos postx;
  AutoFile file;
  undefined1 local_98 [16];
  uchar local_88 [8];
  uchar auStack_80 [8];
  CBlockHeader header;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  postx.super_FlatFilePos.nFile = -1;
  postx.super_FlatFilePos.nPos = 0;
  postx.nTxOffset = 0;
  bVar2 = DB::ReadTxPos((this->m_db)._M_t.
                        super___uniq_ptr_impl<TxIndex::DB,_std::default_delete<TxIndex::DB>_>._M_t.
                        super__Tuple_impl<0UL,_TxIndex::DB_*,_std::default_delete<TxIndex::DB>_>.
                        super__Head_base<0UL,_TxIndex::DB_*,_false>._M_head_impl,tx_hash,&postx);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_006e7376;
  }
  ::node::BlockManager::OpenBlockFile
            (&file,((this->super_BaseIndex).m_chainstate)->m_blockman,&postx.super_FlatFilePos,true)
  ;
  if (file.m_file == (FILE *)0x0) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/txindex.cpp"
    ;
    source_file_00._M_len = 0x61;
    logging_function_00._M_str = "FindTx";
    logging_function_00._M_len = 6;
    LogPrintFormatInternal<char[7]>
              (logging_function_00,source_file_00,0x54,ALL,Error,(ConstevalFormatString<1U>)0xc8ff2e
               ,(char (*) [7])"FindTx");
LAB_006e7346:
    bVar2 = false;
  }
  else {
    CBlockHeader::CBlockHeader(&header);
    CBlockHeader::SerializationOps<AutoFile,CBlockHeader,ActionUnserialize>(&header,&file);
    AutoFile::seek(&file,(ulong)postx.nTxOffset,1);
    local_98._0_8_ = &::TX_WITH_WITNESS;
    local_98._8_8_ = tx;
    ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<AutoFile>
              ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)local_98
               ,&file);
    bVar2 = transaction_identifier<false>::operator!=
                      (&((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->hash,tx_hash);
    if (bVar2) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/txindex.cpp"
      ;
      source_file._M_len = 0x61;
      logging_function._M_str = "FindTx";
      logging_function._M_len = 6;
      LogPrintFormatInternal<char[7]>
                (logging_function,source_file,0x61,ALL,Error,(ConstevalFormatString<1U>)0xc8ff6b,
                 (char (*) [7])"FindTx");
      goto LAB_006e7346;
    }
    CBlockHeader::GetHash((uint256 *)local_98,&header);
    *(uchar (*) [8])((block_hash->super_base_blob<256U>).m_data._M_elems + 0x10) = local_88;
    *(uchar (*) [8])((block_hash->super_base_blob<256U>).m_data._M_elems + 0x18) = auStack_80;
    *(undefined8 *)(block_hash->super_base_blob<256U>).m_data._M_elems = local_98._0_8_;
    *(undefined8 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 8) = local_98._8_8_;
    bVar2 = true;
  }
  AutoFile::~AutoFile(&file);
LAB_006e7376:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool TxIndex::FindTx(const uint256& tx_hash, uint256& block_hash, CTransactionRef& tx) const
{
    CDiskTxPos postx;
    if (!m_db->ReadTxPos(tx_hash, postx)) {
        return false;
    }

    AutoFile file{m_chainstate->m_blockman.OpenBlockFile(postx, true)};
    if (file.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }
    CBlockHeader header;
    try {
        file >> header;
        file.seek(postx.nTxOffset, SEEK_CUR);
        file >> TX_WITH_WITNESS(tx);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s\n", __func__, e.what());
        return false;
    }
    if (tx->GetHash() != tx_hash) {
        LogError("%s: txid mismatch\n", __func__);
        return false;
    }
    block_hash = header.GetHash();
    return true;
}